

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O1

void __thiscall
IntrusiveList<FunctionHandle>::push_back(IntrusiveList<FunctionHandle> *this,FunctionHandle *node)

{
  FunctionHandle *pFVar1;
  bool bVar2;
  
  if (node == (FunctionHandle *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,"void IntrusiveList<FunctionHandle>::push_back(T *) [T = FunctionHandle]");
  }
  if (node->next == (FunctionHandle *)0x0) {
    if (node->listed != true) {
      node->listed = true;
      bVar2 = this->head != (FunctionHandle *)0x0;
      pFVar1 = (FunctionHandle *)this;
      if (bVar2) {
        pFVar1 = this->tail;
      }
      pFVar1->next = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assert_fail("!node->listed",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0x11,"void IntrusiveList<FunctionHandle>::push_back(T *) [T = FunctionHandle]");
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,"void IntrusiveList<FunctionHandle>::push_back(T *) [T = FunctionHandle]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}